

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.h
# Opt level: O3

void __thiscall
slang::ast::MinTypMaxExpression::visitExprs<slang::ast::SampledValueExprVisitor&>
          (MinTypMaxExpression *this,SampledValueExprVisitor *visitor)

{
  Expression::visitExpression<slang::ast::Expression_const,slang::ast::SampledValueExprVisitor&>
            (this->min_,this->min_,visitor);
  Expression::visitExpression<slang::ast::Expression_const,slang::ast::SampledValueExprVisitor&>
            (this->typ_,this->typ_,visitor);
  Expression::visitExpression<slang::ast::Expression_const,slang::ast::SampledValueExprVisitor&>
            (this->max_,this->max_,visitor);
  return;
}

Assistant:

decltype(auto) visitExprs(TVisitor&& visitor) const {
        min().visit(visitor);
        typ().visit(visitor);
        max().visit(visitor);
    }